

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::InFilter::Deserialize(InFilter *this,Deserializer *deserializer)

{
  InFilter *this_00;
  vector<duckdb::Value,_true> values;
  vector<duckdb::Value,_true> local_28;
  
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (&values,deserializer,200,"values");
  this_00 = (InFilter *)operator_new(0x28);
  local_28.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_28.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_28.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InFilter(this_00,&local_28);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_28);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values);
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> InFilter::Deserialize(Deserializer &deserializer) {
	auto values = deserializer.ReadPropertyWithDefault<vector<Value>>(200, "values");
	auto result = duckdb::unique_ptr<InFilter>(new InFilter(std::move(values)));
	return std::move(result);
}